

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.h
# Opt level: O0

IJKLBounds *
getIJKLBounds(IJKLBounds *__return_storage_ptr__,DataFieldInfo *info,Bounds *iBounds,Bounds *jBounds
             ,Bounds *kBounds,Bounds *lBounds)

{
  int *piVar1;
  IJKLBounds *bounds;
  int local_60 [3];
  int local_54;
  int lSize;
  int local_4c;
  int local_48;
  int kSize;
  int local_40;
  int local_3c;
  int jSize;
  int local_34;
  Bounds *pBStack_30;
  int iSize;
  Bounds *lBounds_local;
  Bounds *kBounds_local;
  Bounds *jBounds_local;
  Bounds *iBounds_local;
  DataFieldInfo *info_local;
  
  pBStack_30 = lBounds;
  lBounds_local = kBounds;
  kBounds_local = jBounds;
  jBounds_local = iBounds;
  iBounds_local = (Bounds *)info;
  local_34 = ser::DataFieldInfo::iSize(info);
  jSize = 0;
  piVar1 = std::max<int>(&jSize,&jBounds_local->lower);
  __return_storage_ptr__->iLower = *piVar1;
  local_3c = local_34 + -1;
  piVar1 = std::min<int>(&local_3c,&jBounds_local->upper);
  __return_storage_ptr__->iUpper = *piVar1;
  local_40 = ser::DataFieldInfo::jSize((DataFieldInfo *)iBounds_local);
  kSize = 0;
  piVar1 = std::max<int>(&kSize,&kBounds_local->lower);
  __return_storage_ptr__->jLower = *piVar1;
  local_48 = local_40 + -1;
  piVar1 = std::min<int>(&local_48,&kBounds_local->upper);
  __return_storage_ptr__->jUpper = *piVar1;
  local_4c = ser::DataFieldInfo::kSize((DataFieldInfo *)iBounds_local);
  lSize = 0;
  piVar1 = std::max<int>(&lSize,&lBounds_local->lower);
  __return_storage_ptr__->kLower = *piVar1;
  local_54 = local_4c + -1;
  piVar1 = std::min<int>(&local_54,&lBounds_local->upper);
  __return_storage_ptr__->kUpper = *piVar1;
  local_60[2] = ser::DataFieldInfo::lSize((DataFieldInfo *)iBounds_local);
  local_60[1] = 0;
  piVar1 = std::max<int>(local_60 + 1,&pBStack_30->lower);
  __return_storage_ptr__->lLower = *piVar1;
  local_60[0] = local_60[2] + -1;
  piVar1 = std::min<int>(local_60,&pBStack_30->upper);
  __return_storage_ptr__->lUpper = *piVar1;
  return __return_storage_ptr__;
}

Assistant:

IJKLBounds getIJKLBounds(const ser::DataFieldInfo& info,
                         const Bounds& iBounds, const Bounds& jBounds,
                         const Bounds& kBounds, const Bounds& lBounds)
{
	IJKLBounds bounds;
	int iSize = info.iSize();
	bounds.iLower = std::max(0, iBounds.lower);
	bounds.iUpper = std::min(iSize - 1, iBounds.upper);
	int jSize = info.jSize();
	bounds.jLower = std::max(0, jBounds.lower);
	bounds.jUpper = std::min(jSize - 1, jBounds.upper);
	int kSize = info.kSize();
	bounds.kLower = std::max(0, kBounds.lower);
	bounds.kUpper = std::min(kSize - 1, kBounds.upper);
	int lSize = info.lSize();
	bounds.lLower = std::max(0, lBounds.lower);
	bounds.lUpper = std::min(lSize - 1, lBounds.upper);
	return bounds;
}